

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall EventQueue::SendEvent(EventQueue *this,Event *ev)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Event **ppEVar4;
  undefined1 local_50 [16];
  iterator i;
  int done;
  undefined1 local_30 [8];
  AutoLock _auto_lock_;
  Event *ev_local;
  EventQueue *this_local;
  
  _auto_lock_._16_8_ = ev;
  AutoLock::AutoLock((AutoLock *)local_30,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x32);
  RefCount::AddRef((RefCount *)_auto_lock_._16_8_);
  iVar2 = Event::getPriority((Event *)_auto_lock_._16_8_);
  if (iVar2 == 0) {
    JetHead::list<Event_*>::push_back(&this->mQueue,(Event **)&_auto_lock_.mLine);
  }
  else {
    i.mNode._0_4_ = 0;
    JetHead::list<Event_*>::begin((list<Event_*> *)(local_50 + 8));
    while( true ) {
      JetHead::list<Event_*>::end((list<Event_*> *)local_50);
      bVar1 = JetHead::list<Event_*>::iterator::operator!=
                        ((iterator *)(local_50 + 8),(iterator *)local_50);
      JetHead::list<Event_*>::iterator::~iterator((iterator *)local_50);
      if (!bVar1) break;
      iVar2 = Event::getPriority((Event *)_auto_lock_._16_8_);
      ppEVar4 = JetHead::list<Event_*>::iterator::operator*((iterator *)(local_50 + 8));
      iVar3 = Event::getPriority(*ppEVar4);
      if (iVar3 < iVar2) {
        JetHead::list<Event_*>::iterator::insertBefore
                  ((iterator *)(local_50 + 8),(Event **)&_auto_lock_.mLine);
        i.mNode._0_4_ = 1;
        break;
      }
      JetHead::list<Event_*>::iterator::operator++((iterator *)(local_50 + 8));
    }
    JetHead::list<Event_*>::iterator::~iterator((iterator *)(local_50 + 8));
    if ((int)i.mNode == 0) {
      JetHead::list<Event_*>::push_back(&this->mQueue,(Event **)&_auto_lock_.mLine);
    }
  }
  Condition::Signal(&this->mWait);
  AutoLock::~AutoLock((AutoLock *)local_30);
  return;
}

Assistant:

void EventQueue::SendEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	DebugAutoLock( mLock );
	
	ev->AddRef();

	if ( ev->getPriority() == PRIORITY_NORMAL )
	{
		mQueue.push_back( ev );
	}
	else
	{
		int done = false;
		for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
		{
			if (ev->getPriority() > (*i)->getPriority())
			{
				i.insertBefore(ev);
				done = true;
				break;
			}
		}

		// if we didn't put the event in the list, we add it to the end.
		//  this will happend if all events in the list are of greater priority.
		if ( !done )
		{
			mQueue.push_back( ev );
		}
	}
	
	LOG( "queue size %d", mQueue.size() );	

	mWait.Signal();
}